

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

guint8 * p2sc_hex2bin(char *hex,size_t len)

{
  guint8 gVar1;
  byte bVar2;
  guint8 *pgVar3;
  size_t i;
  ulong uVar4;
  
  pgVar3 = (guint8 *)g_malloc(len >> 1);
  for (uVar4 = 0; len >> 1 != uVar4; uVar4 = uVar4 + 1) {
    gVar1 = h2b(hex[uVar4 * 2]);
    bVar2 = h2b(hex[uVar4 * 2 + 1]);
    pgVar3[uVar4] = bVar2 & 0xf | gVar1 << 4;
  }
  return pgVar3;
}

Assistant:

guint8 *p2sc_hex2bin(const char *hex, size_t len) {
    len /= 2;
    guint8 *bin = (guint8 *) g_malloc(len);

    for (size_t i = 0; i < len; ++i)
        bin[i] = (h2b(hex[2 * i]) << 4) + (h2b(hex[2 * i + 1]) & 0xf);

    return bin;
}